

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int mbedtls_pk_check_pair
              (mbedtls_pk_context *pub,mbedtls_pk_context *prv,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  undefined8 in_RCX;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  int local_4;
  
  if ((*in_RDI == 0) || (*in_RSI == 0)) {
    local_4 = -16000;
  }
  else if (in_RDX == 0) {
    local_4 = -16000;
  }
  else if (*(long *)(*in_RSI + 0x40) == 0) {
    local_4 = -0x3980;
  }
  else {
    if (*(int *)*in_RSI == 5) {
      if (*(int *)*in_RDI != 1) {
        return -0x3f00;
      }
    }
    else if ((*(int *)*in_RSI != 7) && (*in_RDI != *in_RSI)) {
      return -0x3f00;
    }
    local_4 = (**(code **)(*in_RSI + 0x40))(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

int mbedtls_pk_check_pair(const mbedtls_pk_context *pub,
                          const mbedtls_pk_context *prv,
                          int (*f_rng)(void *, unsigned char *, size_t),
                          void *p_rng)
{
    if (pub->pk_info == NULL ||
        prv->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (f_rng == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (prv->pk_info->check_pair_func == NULL) {
        return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
    }

    if (prv->pk_info->type == MBEDTLS_PK_RSA_ALT) {
        if (pub->pk_info->type != MBEDTLS_PK_RSA) {
            return MBEDTLS_ERR_PK_TYPE_MISMATCH;
        }
    } else {
        if ((prv->pk_info->type != MBEDTLS_PK_OPAQUE) &&
            (pub->pk_info != prv->pk_info)) {
            return MBEDTLS_ERR_PK_TYPE_MISMATCH;
        }
    }

    return prv->pk_info->check_pair_func((mbedtls_pk_context *) pub,
                                         (mbedtls_pk_context *) prv,
                                         f_rng, p_rng);
}